

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyTemperatures.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<7,2>::CoherentElastic::
     verifyTemperatures<std::vector<njoy::ENDFtk::ListRecord,std::allocator<njoy::ENDFtk::ListRecord>>>
               (int NP,vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>
                       *temperatures)

{
  borrowed_iterator_t<const_std::vector<njoy::ENDFtk::ListRecord>_&> bVar1;
  undefined8 *puVar2;
  char *unaff_RBX;
  
  bVar1 = ranges::find_if_not_fn::
          operator()<const_std::vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_7_2_CoherentElastic_src_verifyTemperatures_hpp:5:18),_ranges::identity,_true,_0,_0>
                    ((find_if_not_fn *)&ranges::find_if_not,temperatures,NP);
  if (bVar1._M_current ==
      (temperatures->
      super__Vector_base<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int,long>
            ("Expected NP={} for the temperature with index={}",NP,
             ((long)bVar1._M_current -
             (long)(temperatures->
                   super__Vector_base<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyTemperatures( int NP, const Array& temperatures ) {

  auto compare = [NP] ( const auto& entry )
                      { return entry.NPL() == NP; };

  auto iter = ranges::cpp20::find_if_not( temperatures, compare );

  if ( iter != ranges::cpp20::end( temperatures ) ) {

    Log::error( "All S(E,T) functions must have the same size" );
    Log::info( "Expected NP={} for the temperature with index={}", NP,
               ranges::cpp20::distance(
                   ranges::cpp20::begin( temperatures ), iter ) );
    throw std::exception();
  }
}